

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

bool __thiscall Core::fileCheck(Core *this,string *s)

{
  bool bVar1;
  Core *pCVar2;
  allocator<char> local_29;
  
  bVar1 = Parsing::File::setPath(&this->_f,s);
  if (bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,"UWU");
    if (!bVar1) {
      return true;
    }
    pCVar2 = (Core *)&stack0xffffffffffffffd8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pCVar2,"This not a UWU file!",&local_29);
    error(pCVar2,(string *)&stack0xffffffffffffffd8,false);
  }
  else {
    pCVar2 = (Core *)&stack0xffffffffffffffd8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pCVar2,"There is NOWO file!",&local_29);
    error(pCVar2,(string *)&stack0xffffffffffffffd8,false);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return false;
}

Assistant:

bool Core::fileCheck(const std::string &s)
{
    if (!_f.setPath(s))
        return error("There is NOWO file!");

    if (_f.getExtension() != "UWU")
        return error("This not a UWU file!");

    return true;
}